

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringAnisotropyTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::texture::anon_unknown_0::FilteringAnisotropyInstance::iterate
          (TestStatus *__return_storage_ptr__,FilteringAnisotropyInstance *this)

{
  deInt32 *pdVar1;
  TextureFormat TVar2;
  TestLog *pTVar3;
  TestStatus *pTVar4;
  bool bVar5;
  int i;
  VkPhysicalDeviceFeatures *pVVar6;
  TestTexture2D *this_00;
  long lVar7;
  NotSupportedError *this_01;
  int iVar8;
  void *pvVar9;
  uint uVar10;
  TestTexture2DSp texture;
  Surface renderedAnisotropyFrame;
  Surface renderedFrame;
  vector<float,_std::allocator<float>_> texCoord;
  float position [16];
  TextureRenderer renderer;
  TestTexture2DSp local_378;
  ConstPixelBufferAccess local_360;
  Surface local_338;
  Surface local_320;
  vector<float,_std::allocator<float>_> local_308;
  Vec4 local_2f0;
  ConstPixelBufferAccess local_2e0;
  PixelBufferAccess local_2b8;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  TestStatus *local_270;
  TextureRenderer local_268;
  
  pVVar6 = Context::getDeviceFeatures((this->super_TestInstance).m_context);
  if (pVVar6->samplerAnisotropy == 0) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,
               "Skipping anisotropic tests since the device does not support anisotropic filtering."
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureFilteringAnisotropyTests.cpp"
               ,0x68);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  util::TextureRenderer::TextureRenderer
            (&local_268,(this->super_TestInstance).m_context,VK_SAMPLE_COUNT_1_BIT,0x80,0x80);
  this_00 = (TestTexture2D *)operator_new(0x70);
  local_2b8.super_ConstPixelBufferAccess.m_format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  vkt::pipeline::TestTexture2D::TestTexture2D(this_00,(TextureFormat *)&local_2b8,0x80,0x80);
  local_378.m_state = (SharedPtrStateBase *)0x0;
  local_378.m_ptr = this_00;
  local_270 = __return_storage_ptr__;
  local_378.m_state = (SharedPtrStateBase *)operator_new(0x20);
  uVar10 = 0;
  (local_378.m_state)->strongRefCount = 0;
  (local_378.m_state)->weakRefCount = 0;
  (local_378.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d67150;
  local_378.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)this_00;
  (local_378.m_state)->strongRefCount = 1;
  (local_378.m_state)->weakRefCount = 1;
  if ((uint)(this->m_refParams).super_ReferenceParams.maxLevel < 0x7fffffff) {
    do {
      (*((local_378.m_ptr)->super_TestTexture)._vptr_TestTexture[7])
                (&local_2b8,local_378.m_ptr,(ulong)uVar10,0);
      iVar8 = local_2b8.super_ConstPixelBufferAccess.m_size.m_data[1] + 7;
      if (-1 < (long)local_2b8.super_ConstPixelBufferAccess.m_size.m_data._0_8_) {
        iVar8 = local_2b8.super_ConstPixelBufferAccess.m_size.m_data[1];
      }
      iVar8 = iVar8 >> 3;
      if (iVar8 < 2) {
        iVar8 = 1;
      }
      (*((local_378.m_ptr)->super_TestTexture)._vptr_TestTexture[7])
                (&local_2b8,local_378.m_ptr,(ulong)uVar10,0);
      local_360.m_format.order = R;
      local_360.m_format.type = SNORM_INT8;
      local_360.m_size.m_data[0] = 0;
      local_360.m_size.m_data[1] = 0x3f800000;
      lVar7 = 0;
      do {
        local_2e0.m_size.m_data[lVar7 + -2] = 0x3f800000;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
      tcu::fillWithGrid(&local_2b8,iVar8,(Vec4 *)&local_360,(Vec4 *)&local_2e0);
      uVar10 = uVar10 + 1;
    } while ((int)uVar10 < (this->m_refParams).super_ReferenceParams.maxLevel + 1);
  }
  util::TextureRenderer::setViewport(&local_268,0.0,0.0,128.0,128.0);
  util::TextureRenderer::add2DTexture(&local_268,&local_378);
  tcu::Surface::Surface(&local_320,0x80,0x80);
  tcu::Surface::Surface(&local_338,0x80,0x80);
  pTVar4 = local_270;
  local_288 = 0x3f80000040600000;
  uStack_280 = 0x3f80000000000000;
  local_2b8.super_ConstPixelBufferAccess.m_data = (void *)0xbf80000040600000;
  uStack_290 = 0x4060000000000000;
  local_2b8.super_ConstPixelBufferAccess.m_size.m_data[2] = -0x3fa00000;
  local_2b8.super_ConstPixelBufferAccess.m_pitch.m_data[0] = 0x3f800000;
  local_2b8.super_ConstPixelBufferAccess.m_pitch.m_data[1] = 0;
  local_2b8.super_ConstPixelBufferAccess.m_pitch.m_data[2] = 0x3f800000;
  local_2b8.super_ConstPixelBufferAccess.m_format.order = 0xc0600000;
  local_2b8.super_ConstPixelBufferAccess.m_format.type = 0xbf800000;
  local_2b8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
  local_2b8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x40600000;
  lVar7 = 0;
  local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_360.m_format.order = R;
  local_360.m_format.type = SNORM_INT8;
  do {
    local_2e0.m_size.m_data[lVar7 + -2] = 0x3f800000;
    lVar7 = lVar7 + 1;
  } while (lVar7 == 1);
  glu::TextureTestUtil::computeQuadTexCoord2D(&local_308,(Vec2 *)&local_360,(Vec2 *)&local_2e0);
  util::TextureRenderer::renderQuad
            (&local_268,&local_320,(float *)&local_2b8,0,
             local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&(this->m_refParams).super_ReferenceParams,1.0);
  util::TextureRenderer::renderQuad
            (&local_268,&local_338,(float *)&local_2b8,0,
             local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&(this->m_refParams).super_ReferenceParams,
             (this->m_refParams).maxAnisotropy);
  pTVar3 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_2e0.m_format.order = RGBA;
  local_2e0.m_format.type = UNORM_INT8;
  pvVar9 = (void *)local_320.m_pixels.m_cap;
  if ((void *)local_320.m_pixels.m_cap != (void *)0x0) {
    pvVar9 = local_320.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_360,&local_2e0.m_format,local_320.m_width,
             local_320.m_height,1,pvVar9);
  local_2f0.m_data[0] = 1.12104e-44;
  local_2f0.m_data[1] = 4.2039e-45;
  pvVar9 = (void *)local_338.m_pixels.m_cap;
  if ((void *)local_338.m_pixels.m_cap != (void *)0x0) {
    pvVar9 = local_338.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_2e0,(TextureFormat *)&local_2f0,local_338.m_width,
             local_338.m_height,1,pvVar9);
  bVar5 = tcu::fuzzyCompare(pTVar3,"Expecting comparison to pass","Expecting comparison to pass",
                            &local_360,&local_2e0,0.05,COMPARE_LOG_RESULT);
  if (bVar5) {
    pTVar3 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    local_2e0.m_format.order = RGBA;
    local_2e0.m_format.type = UNORM_INT8;
    if ((void *)local_320.m_pixels.m_cap != (void *)0x0) {
      local_320.m_pixels.m_cap = (size_t)local_320.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_360,&local_2e0.m_format,local_320.m_width,
               local_320.m_height,1,(void *)local_320.m_pixels.m_cap);
    local_2f0.m_data[0] = 1.12104e-44;
    local_2f0.m_data[1] = 4.2039e-45;
    if ((void *)local_338.m_pixels.m_cap != (void *)0x0) {
      local_338.m_pixels.m_cap = (size_t)local_338.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_2e0,(TextureFormat *)&local_2f0,local_338.m_width,
               local_338.m_height,1,(void *)local_338.m_pixels.m_cap);
    lVar7 = 0;
    do {
      local_2f0.m_data[lVar7] = 0.05;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    bVar5 = tcu::floatThresholdCompare
                      (pTVar3,"Expecting comparison to fail","Expecting comparison to fail",
                       &local_360,&local_2e0,&local_2f0,COMPARE_LOG_RESULT);
    if (!bVar5) {
      if (local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (float *)0x0) {
        operator_delete(local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      tcu::Surface::~Surface(&local_338);
      tcu::Surface::~Surface(&local_320);
      TVar2 = (TextureFormat)(local_2b8.super_ConstPixelBufferAccess.m_size.m_data + 2);
      local_2b8.super_ConstPixelBufferAccess.m_format = TVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Pass","");
      pTVar4->m_code = QP_TEST_RESULT_PASS;
      (pTVar4->m_description)._M_dataplus._M_p = (pointer)&(pTVar4->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pTVar4->m_description,local_2b8.super_ConstPixelBufferAccess.m_format,
                 (undefined1 *)
                 (local_2b8.super_ConstPixelBufferAccess.m_size.m_data._0_8_ +
                 (long)local_2b8.super_ConstPixelBufferAccess.m_format));
      if (local_2b8.super_ConstPixelBufferAccess.m_format != TVar2) {
        operator_delete((void *)local_2b8.super_ConstPixelBufferAccess.m_format,
                        local_2b8.super_ConstPixelBufferAccess._16_8_ + 1);
      }
      goto LAB_008406f3;
    }
    local_360.m_format = (TextureFormat)(local_360.m_size.m_data + 2);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"Fail","");
    pTVar4->m_code = QP_TEST_RESULT_FAIL;
    (pTVar4->m_description)._M_dataplus._M_p = (pointer)&(pTVar4->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar4->m_description,local_360.m_format,
               local_360.m_size.m_data._0_8_ + (long)local_360.m_format);
  }
  else {
    local_360.m_format = (TextureFormat)(local_360.m_size.m_data + 2);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"Fail","");
    pTVar4->m_code = QP_TEST_RESULT_FAIL;
    (pTVar4->m_description)._M_dataplus._M_p = (pointer)&(pTVar4->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar4->m_description,local_360.m_format,
               local_360.m_size.m_data._0_8_ + (long)local_360.m_format);
  }
  if (local_360.m_format != (TextureFormat)(local_360.m_size.m_data + 2)) {
    operator_delete((void *)local_360.m_format,local_360._16_8_ + 1);
  }
  if (local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_338);
  tcu::Surface::~Surface(&local_320);
LAB_008406f3:
  if (local_378.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_378.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_378.m_ptr = (TestTexture2D *)0x0;
      (*(local_378.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_378.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_378.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_378.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_378.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  util::TextureRenderer::~TextureRenderer(&local_268);
  return pTVar4;
}

Assistant:

tcu::TestStatus	iterate	(void)
	{
		// Check device for anisotropic filtering support
		if (!m_context.getDeviceFeatures().samplerAnisotropy)
			TCU_THROW(NotSupportedError, "Skipping anisotropic tests since the device does not support anisotropic filtering.");

		TextureRenderer	renderer	(m_context, VK_SAMPLE_COUNT_1_BIT, ANISOTROPY_TEST_RESOLUTION, ANISOTROPY_TEST_RESOLUTION);
		TestTexture2DSp	texture		= TestTexture2DSp(new pipeline::TestTexture2D(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM), ANISOTROPY_TEST_RESOLUTION, ANISOTROPY_TEST_RESOLUTION));

		for (int levelNdx = 0; levelNdx < m_refParams.maxLevel + 1; levelNdx++)
		{
			const int gridSize = max(texture->getLevel(levelNdx, 0).getHeight() / 8, 1);
			tcu::fillWithGrid(texture->getLevel(levelNdx, 0), gridSize, Vec4(0.0f, 0.0f, 0.0f, 1.0f), Vec4(1.0f));
		}

		renderer.setViewport(0.0f, 0.0f, static_cast<float>(ANISOTROPY_TEST_RESOLUTION), static_cast<float>(ANISOTROPY_TEST_RESOLUTION));
		renderer.add2DTexture(texture);

		{
			Surface			renderedFrame			(ANISOTROPY_TEST_RESOLUTION, ANISOTROPY_TEST_RESOLUTION);
			Surface			renderedAnisotropyFrame	(ANISOTROPY_TEST_RESOLUTION, ANISOTROPY_TEST_RESOLUTION);
			const float		position[]				=
			{
				-3.5f, -1.0f, 0.0f, 3.5f,
				-3.5f, +1.0f, 0.0f, 1.0f,
				+3.5f, -1.0f, 0.0f, 3.5f,
				+3.5f, +1.0f, 0.0f, 1.0f
			};
			vector<float>	texCoord;

			computeQuadTexCoord2D(texCoord, Vec2(0.0f), Vec2(1.0f));

			renderer.renderQuad(renderedFrame,				position, 0, &texCoord[0], m_refParams, 1.0f);
			renderer.renderQuad(renderedAnisotropyFrame,	position, 0, &texCoord[0], m_refParams, m_refParams.maxAnisotropy);

			if (!tcu::fuzzyCompare(m_context.getTestContext().getLog(), "Expecting comparison to pass", "Expecting comparison to pass",
					renderedFrame.getAccess(), renderedAnisotropyFrame.getAccess(), 0.05f, tcu::COMPARE_LOG_RESULT))
				return tcu::TestStatus::fail("Fail");

			if (floatThresholdCompare (m_context.getTestContext().getLog(), "Expecting comparison to fail", "Expecting comparison to fail",
					renderedFrame.getAccess(), renderedAnisotropyFrame.getAccess(), Vec4(0.05f), tcu::COMPARE_LOG_RESULT))
				return tcu::TestStatus::fail("Fail");
		}
		return tcu::TestStatus::pass("Pass");
	}